

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cpp
# Opt level: O1

ssize_t __thiscall rw::BMPheader::read(BMPheader *this,int __fd,void *__buf,size_t __nbytes)

{
  Stream *this_00;
  uint16 uVar1;
  uint32 uVar2;
  undefined4 in_register_00000034;
  
  this_00 = (Stream *)CONCAT44(in_register_00000034,__fd);
  uVar1 = Stream::readU16((Stream *)CONCAT44(in_register_00000034,__fd));
  this->magic = uVar1;
  uVar2 = Stream::readU32(this_00);
  this->size = uVar2;
  uVar1 = Stream::readU16(this_00);
  this->reserved[0] = uVar1;
  uVar1 = Stream::readU16(this_00);
  this->reserved[1] = uVar1;
  uVar2 = Stream::readU32(this_00);
  this->offset = uVar2;
  return (ulong)(this->magic == 0x4d42);
}

Assistant:

bool32
BMPheader::read(Stream *stream)
{
	magic = stream->readU16();
	size = stream->readU32();
	reserved[0] = stream->readU16();
	reserved[1] = stream->readU16();
	offset = stream->readU32();
	return magic == 0x4D42;
}